

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O0

uint32_t hash_bitmap(ALLEGRO_BITMAP *bmp)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  undefined8 in_RDI;
  char *data;
  uint32_t hash;
  int h;
  int w;
  int y;
  int x;
  ALLEGRO_LOCKED_REGION *lr;
  undefined4 local_24;
  undefined4 local_18;
  undefined4 local_14;
  
  iVar1 = al_get_bitmap_width(in_RDI);
  iVar2 = al_get_bitmap_height(in_RDI);
  local_24 = 0x811c9dc5;
  plVar3 = (long *)al_lock_bitmap(in_RDI,0x19,1);
  for (local_18 = 0; local_18 < iVar2; local_18 = local_18 + 1) {
    lVar4 = *plVar3 + (long)(local_18 * *(int *)((long)plVar3 + 0xc));
    for (local_14 = 0; local_14 < iVar1; local_14 = local_14 + 1) {
      local_24 = ((int)*(char *)(lVar4 + (local_14 << 2)) ^
                 ((int)*(char *)(lVar4 + (local_14 * 4 + 1)) ^
                 ((int)*(char *)(lVar4 + (local_14 * 4 + 2)) ^
                 ((int)*(char *)(lVar4 + (local_14 * 4 + 3)) ^ local_24) * 0x1000193) * 0x1000193) *
                 0x1000193) * 0x1000193;
    }
  }
  al_unlock_bitmap(in_RDI);
  return local_24;
}

Assistant:

static uint32_t hash_bitmap(ALLEGRO_BITMAP *bmp)
{
   ALLEGRO_LOCKED_REGION *lr;
   int x, y, w, h;
   uint32_t hash;

   w = al_get_bitmap_width(bmp);
   h = al_get_bitmap_height(bmp);
   hash = FNV_OFFSET_BASIS;

   lr = al_lock_bitmap(bmp, ALLEGRO_PIXEL_FORMAT_ABGR_8888_LE,
      ALLEGRO_LOCK_READONLY);

   for (y = 0; y < h; y++) {
      /* Oops, I unintentially committed the first version of this with signed
       * chars and computing in BGRA order, so leave it like that so we don't
       * have to update a bunch of old hashes.
       */
      signed char const *data = ((signed char const *)lr->data) + y*lr->pitch;
      for (x = 0; x < w; x++) {
         hash ^= data[x*4 + 3]; hash *= FNV_PRIME;
         hash ^= data[x*4 + 2]; hash *= FNV_PRIME;
         hash ^= data[x*4 + 1]; hash *= FNV_PRIME;
         hash ^= data[x*4 + 0]; hash *= FNV_PRIME;
      }
   }

   al_unlock_bitmap(bmp);

   return hash;
}